

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

bool __thiscall
cppcms::http::request::parse_form_urlencoded(request *this,char *begin,char *end,form_type *out)

{
  util *end_00;
  util *begin_00;
  util *end_01;
  util *this_00;
  string name;
  string value;
  string local_b0;
  string local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  do {
    this_00 = (util *)begin;
    if (end <= this_00) break;
    local_70.first._M_dataplus._M_p._0_1_ = 0x26;
    end_00 = (util *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (this_00,end,&local_70);
    local_70.first._M_dataplus._M_p._0_1_ = 0x3d;
    begin_00 = (util *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                 (this_00,end_00,&local_70);
    begin = (char *)this_00;
    if (begin_00 != this_00 && begin_00 != end_00) {
      end_01 = end_00;
      util::urldecode_abi_cxx11_(&local_b0,this_00,(char *)begin_00,(char *)end_00);
      util::urldecode_abi_cxx11_(&local_90,begin_00 + 1,(char *)end_00,(char *)end_01);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_70,&local_b0,&local_90);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)out,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
        operator_delete(local_70.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70.first._M_dataplus._M_p._1_7_,local_70.first._M_dataplus._M_p._0_1_)
          != &local_70.first.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70.first._M_dataplus._M_p._1_7_,
                                 local_70.first._M_dataplus._M_p._0_1_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      begin = (char *)(end_00 + 1);
    }
  } while (begin_00 != this_00 && begin_00 != end_00);
  return end <= this_00;
}

Assistant:

bool request::parse_form_urlencoded(char const *begin,char const *end,form_type &out)
{
	char const *p;
	for(p=begin;p<end;) {
		char const *e=std::find(p,end,'&');
		char const *name_end=std::find(p,e,'=');
		if(name_end==e || name_end==p)
			return false;
		std::string name=util::urldecode(p,name_end);
		std::string value=util::urldecode(name_end+1,e);
		out.insert(std::make_pair(name,value));
		p=e+1;
	}
	return true;
}